

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O0

_Bool mainchan_rcvd_exit_status(Channel *chan,int status)

{
  long lVar1;
  LogContext *ctx;
  char *event;
  PacketProtocolLayer *ppl;
  mainchan *mc;
  int status_local;
  Channel *chan_local;
  
  if (chan->vt == &mainchan_channelvt) {
    lVar1 = *(long *)&chan[-4].initial_fixed_window_size;
    ssh_got_exitcode(*(Ssh **)(*(long *)&chan[-4].initial_fixed_window_size + 0x58),status);
    ctx = *(LogContext **)(lVar1 + 0x40);
    event = dupprintf("Session sent command exit status %d",(ulong)(uint)status);
    logevent_and_free(ctx,event);
    return true;
  }
  __assert_fail("chan->vt == &mainchan_channelvt",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/mainchan.c",
                0x18c,"_Bool mainchan_rcvd_exit_status(Channel *, int)");
}

Assistant:

static bool mainchan_rcvd_exit_status(Channel *chan, int status)
{
    assert(chan->vt == &mainchan_channelvt);
    mainchan *mc = container_of(chan, mainchan, chan);
    PacketProtocolLayer *ppl = mc->ppl; /* for ppl_logevent */

    ssh_got_exitcode(mc->ppl->ssh, status);
    ppl_logevent("Session sent command exit status %d", status);
    return true;
}